

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  ParseContext *ctx_local;
  char *ptr_local;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num * 8 + 3),this->unknown_);
  }
  this_local = (UnknownFieldLiteParserHelper *)
               ParseContext::ParseGroup<google::protobuf::internal::UnknownFieldLiteParserHelper>
                         (ctx,this,ptr,num * 8 + 3);
  if (this_local == (UnknownFieldLiteParserHelper *)0x0) {
    this_local = (UnknownFieldLiteParserHelper *)0x0;
  }
  else if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num * 8 + 4),this->unknown_);
  }
  return (char *)this_local;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }